

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

unique_ptr<Lexer,_std::default_delete<Lexer>_>
createLexer(CommandLineParseResult *parseResult,Option *eval,Option *file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __uniq_ptr_impl<FileLexer,_std::default_delete<FileLexer>_> _Var2;
  const_iterator cVar3;
  TextLexer *this;
  tuple<FileLexer_*,_std::default_delete<FileLexer>_> this_00;
  runtime_error *this_01;
  Option *in_RCX;
  ifstream stream;
  __uniq_ptr_impl<FileLexer,_std::default_delete<FileLexer>_> local_438;
  string local_430;
  int aiStack_410 [122];
  string local_228 [16];
  
  cVar3 = std::
          _Hashtable<Option,_std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Option>,_std::hash<Option>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<Option,_std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Option>,_std::hash<Option>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)&eval[1].ids,file);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    CommandLineParseResult::getValue_abi_cxx11_(local_228,(CommandLineParseResult *)eval,in_RCX);
    std::ifstream::ifstream(&local_430,(string *)local_228,_S_in);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
      operator_delete(local_228[0]._M_dataplus._M_p,local_228[0].field_2._M_allocated_capacity + 1);
    }
    if (*(int *)((long)aiStack_410 + *(long *)(local_430._M_dataplus._M_p + -0x18)) != 0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Invalid path");
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00.super__Tuple_impl<0UL,_FileLexer_*,_std::default_delete<FileLexer>_>.
    super__Head_base<0UL,_FileLexer_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_FileLexer_*,_std::default_delete<FileLexer>_>)operator_new(0x220);
    std::ifstream::ifstream(local_228,(ifstream *)&local_430);
    FileLexer::FileLexer
              ((FileLexer *)
               this_00.super__Tuple_impl<0UL,_FileLexer_*,_std::default_delete<FileLexer>_>.
               super__Head_base<0UL,_FileLexer_*,_false>._M_head_impl,(ifstream *)local_228);
    local_438._M_t.super__Tuple_impl<0UL,_FileLexer_*,_std::default_delete<FileLexer>_>.
    super__Head_base<0UL,_FileLexer_*,_false>._M_head_impl =
         (tuple<FileLexer_*,_std::default_delete<FileLexer>_>)
         (tuple<FileLexer_*,_std::default_delete<FileLexer>_>)
         this_00.super__Tuple_impl<0UL,_FileLexer_*,_std::default_delete<FileLexer>_>.
         super__Head_base<0UL,_FileLexer_*,_false>._M_head_impl;
    std::ifstream::~ifstream(local_228);
    _Var2._M_t.super__Tuple_impl<0UL,_FileLexer_*,_std::default_delete<FileLexer>_>.
    super__Head_base<0UL,_FileLexer_*,_false>._M_head_impl =
         local_438._M_t.super__Tuple_impl<0UL,_FileLexer_*,_std::default_delete<FileLexer>_>.
         super__Head_base<0UL,_FileLexer_*,_false>._M_head_impl;
    local_438._M_t.super__Tuple_impl<0UL,_FileLexer_*,_std::default_delete<FileLexer>_>.
    super__Head_base<0UL,_FileLexer_*,_false>._M_head_impl =
         (tuple<FileLexer_*,_std::default_delete<FileLexer>_>)
         (_Tuple_impl<0UL,_FileLexer_*,_std::default_delete<FileLexer>_>)0x0;
    (parseResult->flags)._M_h._M_buckets =
         (__buckets_ptr)
         _Var2._M_t.super__Tuple_impl<0UL,_FileLexer_*,_std::default_delete<FileLexer>_>.
         super__Head_base<0UL,_FileLexer_*,_false>._M_head_impl;
    std::unique_ptr<FileLexer,_std::default_delete<FileLexer>_>::~unique_ptr
              ((unique_ptr<FileLexer,_std::default_delete<FileLexer>_> *)&local_438);
    std::ifstream::~ifstream(&local_430);
  }
  else {
    CommandLineParseResult::getValue_abi_cxx11_(&local_430,(CommandLineParseResult *)eval,file);
    this = (TextLexer *)operator_new(0x30);
    paVar1 = &local_430.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p == paVar1) {
      local_228[0].field_2._8_8_ = local_430.field_2._8_8_;
      local_228[0]._M_dataplus._M_p = (pointer)&local_228[0].field_2;
    }
    else {
      local_228[0]._M_dataplus._M_p = local_430._M_dataplus._M_p;
    }
    local_228[0].field_2._M_allocated_capacity._1_7_ = local_430.field_2._M_allocated_capacity._1_7_
    ;
    local_228[0].field_2._M_local_buf[0] = local_430.field_2._M_local_buf[0];
    local_228[0]._M_string_length = local_430._M_string_length;
    local_430._M_string_length = 0;
    local_430.field_2._M_local_buf[0] = '\0';
    local_430._M_dataplus._M_p = (pointer)paVar1;
    TextLexer::TextLexer(this,local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
      operator_delete(local_228[0]._M_dataplus._M_p,local_228[0].field_2._M_allocated_capacity + 1);
    }
    (parseResult->flags)._M_h._M_buckets = (__buckets_ptr)this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != paVar1) {
      operator_delete(local_430._M_dataplus._M_p,
                      CONCAT71(local_430.field_2._M_allocated_capacity._1_7_,
                               local_430.field_2._M_local_buf[0]) + 1);
    }
  }
  return (__uniq_ptr_data<Lexer,_std::default_delete<Lexer>,_true,_true>)
         (__uniq_ptr_data<Lexer,_std::default_delete<Lexer>,_true,_true>)parseResult;
}

Assistant:

auto createLexer(CommandLineParseResult parseResult, Option* eval, Option* file) -> std::unique_ptr<Lexer> {
    if (parseResult.hasOption(*eval)) {
        return std::make_unique<TextLexer>(parseResult.getValue(*eval));
    } else {
        auto stream = std::ifstream(parseResult.getValue(*file), std::ios::in);
        if (!stream.good())
            throw std::runtime_error("Invalid path");

        return std::make_unique<FileLexer>(std::move(stream));
    }
}